

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O2

VariableIndex __thiscall
cnn::ComputationGraph::add_const_parameters(ComputationGraph *this,Parameters *p)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  long in_RDX;
  Node *local_20;
  
  *(int *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)((ulong)(*(long *)(p->dim).d - (long)(p->super_ParametersBase)._vptr_ParametersBase) >>
            3);
  local_20 = (Node *)operator_new(0x80);
  (local_20->dim).nd = 0;
  (local_20->dim).bd = 1;
  (local_20->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_20->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_20->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20->_vptr_Node = (_func_int **)&PTR__Node_002b87c0;
  pVVar1 = *(pointer *)(in_RDX + 0x10);
  pVVar2 = *(pointer *)(in_RDX + 0x18);
  pVVar3 = *(pointer *)(in_RDX + 0x20);
  local_20[1]._vptr_Node = *(_func_int ***)(in_RDX + 8);
  local_20[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = pVVar1;
  local_20[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  local_20[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pVVar3;
  local_20[1].dim.d[0] = *(uint *)(in_RDX + 0x28);
  *(long *)(local_20[1].dim.d + 2) = in_RDX;
  std::vector<cnn::Node*,std::allocator<cnn::Node*>>::emplace_back<cnn::Node*>
            ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)p,&local_20);
  set_dim_for_new_node((ComputationGraph *)p,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

VariableIndex ComputationGraph::add_const_parameters(Parameters* p) {
  VariableIndex new_node_index(nodes.size());
  ConstParameterNode* new_node = new ConstParameterNode(p);
  nodes.push_back(new_node);
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}